

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch.hpp
# Opt level: O2

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpatch::detail::
from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (detail *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *source,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *target,
          string_view_type *path)

{
  byte bVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  type_conflict9 tVar4;
  bool bVar5;
  byte bVar6;
  size_t sVar7;
  size_t sVar8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar9;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *target_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  const_object_range_type *this_00;
  size_t i;
  unsigned_long value;
  array_range_type aVar12;
  array_range_type aVar13;
  array_range_type aVar14;
  const_object_iterator cVar15;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> bVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> temp_diff;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> temp_diff_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val_4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val_2;
  string_view_type local_40;
  
  ss._M_string_length = 0;
  ss.field_2._M_allocated_capacity = 0;
  ss.field_2._8_8_ = 0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             (array *)&ss,none);
  json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  ::~json_array((json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
                 *)&ss);
  tVar4 = jsoncons::operator==(source,target);
  uVar10 = extraout_RDX;
  if (!tVar4) {
    bVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                      (source);
    if (bVar5) {
      bVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                        (target);
      if (bVar5) {
        sVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          (source);
        sVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          (target);
        if (sVar8 < sVar7) {
          sVar7 = sVar8;
        }
        for (value = 0; sVar7 != value; value = value + 1) {
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&ss,path,(allocator<char> *)&temp_diff);
          std::__cxx11::string::push_back('\0');
          jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>(value,&ss);
          pbVar9 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                             (source,value);
          target_00 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                                (target,value);
          temp_diff_1.field_0._0_8_ = ss._M_string_length;
          temp_diff_1.field_0.json_const_pointer_.ref_._M_data =
               (reference_wrapper<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                )(reference_wrapper<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  )ss._M_dataplus._M_p;
          from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                    ((detail *)&temp_diff,pbVar9,target_00,(string_view_type *)&temp_diff_1);
          aVar12 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                   array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                *)this);
          aVar13 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                   array_range(&temp_diff);
          aVar14 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                   array_range(&temp_diff);
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                    ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this
                     ,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                      aVar12.last_._M_current,
                     (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     aVar13.first_._M_current,
                     (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     aVar14.last_._M_current);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                    (&temp_diff);
          std::__cxx11::string::~string((string *)&ss);
        }
        sVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          (source);
        while( true ) {
          sVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                            (target);
          if (sVar7 <= sVar8) break;
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&ss,path,(allocator<char> *)&temp_diff);
          std::__cxx11::string::push_back('\0');
          sVar7 = sVar7 - 1;
          jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>(sVar7,&ss);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                    (&val,(string *)&temp_diff);
          jsonpatch_names<char>::op_name_abi_cxx11_();
          val_2.field_0._0_8_ = temp_diff.field_0.int64_.val_;
          val_2.field_0.int64_.val_ = temp_diff.field_0._0_8_;
          jsonpatch_names<char>::remove_name_abi_cxx11_();
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert_or_assign<std::__cxx11::string>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)&val_4,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)&val
                     ,(string_view_type *)&val_2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &temp_diff_1);
          std::__cxx11::string::~string((string *)&temp_diff_1);
          std::__cxx11::string::~string((string *)&temp_diff);
          jsonpatch_names<char>::path_name_abi_cxx11_();
          val_4.field_0._0_8_ = temp_diff.field_0.int64_.val_;
          val_4.field_0.int64_.val_ = temp_diff.field_0._0_8_;
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert_or_assign<std::__cxx11::string&>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)&temp_diff_1,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)&val
                     ,(string_view_type *)&val_4,&ss);
          std::__cxx11::string::~string((string *)&temp_diff);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     this,&val);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                    (&val);
          std::__cxx11::string::~string((string *)&ss);
        }
        sVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          (source);
        while( true ) {
          sVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                            (target);
          uVar10 = extraout_RDX_01;
          if (sVar8 <= sVar7) break;
          pbVar9 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                             (target,sVar7);
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&ss,path,(allocator<char> *)&temp_diff);
          std::__cxx11::string::push_back('\0');
          jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>(sVar7,&ss);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                    (&val,(string *)&temp_diff);
          jsonpatch_names<char>::op_name_abi_cxx11_();
          val_2.field_0._0_8_ = temp_diff.field_0.int64_.val_;
          val_2.field_0.int64_.val_ = temp_diff.field_0._0_8_;
          jsonpatch_names<char>::add_name_abi_cxx11_();
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert_or_assign<std::__cxx11::string>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)&val_4,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)&val
                     ,(string_view_type *)&val_2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &temp_diff_1);
          std::__cxx11::string::~string((string *)&temp_diff_1);
          std::__cxx11::string::~string((string *)&temp_diff);
          jsonpatch_names<char>::path_name_abi_cxx11_();
          val_4.field_0._0_8_ = temp_diff.field_0.int64_.val_;
          val_4.field_0.int64_.val_ = temp_diff.field_0._0_8_;
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert_or_assign<std::__cxx11::string&>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)&temp_diff_1,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)&val
                     ,(string_view_type *)&val_4,&ss);
          std::__cxx11::string::~string((string *)&temp_diff);
          jsonpatch_names<char>::value_name_abi_cxx11_();
          val_4.field_0._0_8_ = temp_diff.field_0.int64_.val_;
          val_4.field_0.int64_.val_ = temp_diff.field_0._0_8_;
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)&temp_diff_1,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)&val
                     ,(string_view_type *)&val_4,pbVar9);
          std::__cxx11::string::~string((string *)&temp_diff);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     this,&val);
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                    (&val);
          std::__cxx11::string::~string((string *)&ss);
          sVar7 = sVar7 + 1;
        }
        goto LAB_002f2787;
      }
    }
    bVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                      (source);
    if (bVar5) {
      bVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                        (target);
      if (bVar5) {
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((const_object_range_type *)&ss,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)source
                  );
        uVar10 = ss.field_2._M_allocated_capacity;
        bVar1 = (byte)ss._M_string_length;
        uVar3 = ss.field_2._M_local_buf[8];
        bVar6 = (byte)ss._M_string_length & ss.field_2._M_local_buf[8];
        _Var11 = ss._M_dataplus;
        while( true ) {
          bVar5 = bVar1 == uVar3;
          if ((bVar6 & 1) != 0) {
            bVar5 = _Var11._M_p == (pointer)uVar10;
          }
          if (bVar5) break;
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&temp_diff,path,(allocator<char> *)&temp_diff_1);
          std::__cxx11::string::push_back
                    ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &temp_diff);
          jsonpointer::escape<std::__cxx11::string,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var11._M_p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp_diff
                    );
          temp_diff_1.field_0.int64_.val_ =
               (int64_t)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Var11._M_p)->_M_dataplus)._M_p;
          temp_diff_1.field_0._0_8_ =
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var11._M_p)->
               _M_string_length;
          cVar15 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                   find_abi_cxx11_((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                    *)target,(string_view_type *)&temp_diff_1);
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          object_range_abi_cxx11_
                    ((const_object_range_type *)&temp_diff_1,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     target);
          if ((((undefined1  [16])cVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
             ((local_b0[0]._M_local_buf[8] & 1) == 0)) {
            if (cVar15.has_value_ == (bool)local_b0[0]._8_1_) goto LAB_002f2590;
LAB_002f251b:
            val_4.field_0._0_8_ = temp_diff.field_0.int64_.val_;
            val_4.field_0.int64_.val_ = temp_diff.field_0._0_8_;
            from_diff<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                      ((detail *)&temp_diff_1,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )((long)_Var11._M_p + 0x20),&(cVar15.it_._M_current._M_current)->value_,
                       (string_view_type *)&val_4);
            aVar12 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)this);
            aVar13 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range(&temp_diff_1);
            aVar14 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range(&temp_diff_1);
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                      ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)aVar12.last_._M_current,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )aVar13.first_._M_current,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )aVar14.last_._M_current);
            this_00 = (const_object_range_type *)&temp_diff_1;
          }
          else {
            if (cVar15.it_._M_current._M_current !=
                (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)local_b0[0]._0_8_) goto LAB_002f251b;
LAB_002f2590:
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                      (&val_2,(const_object_range_type *)&temp_diff_1);
            jsonpatch_names<char>::op_name_abi_cxx11_();
            local_40._M_len = temp_diff_1.field_0.int64_.val_;
            local_40._M_str = (char *)temp_diff_1.field_0._0_8_;
            jsonpatch_names<char>::remove_name_abi_cxx11_();
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)&val,(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                *)&val_2,&local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val_4);
            std::__cxx11::string::~string((string *)&val_4);
            std::__cxx11::string::~string((string *)&temp_diff_1);
            jsonpatch_names<char>::path_name_abi_cxx11_();
            val.field_0._0_8_ = temp_diff_1.field_0.int64_.val_;
            val.field_0.int64_.val_ = temp_diff_1.field_0._0_8_;
            this_00 = (const_object_range_type *)&val_2;
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string&>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)&val_4,
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       this_00,(string_view_type *)&val,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &temp_diff);
            std::__cxx11::string::~string((string *)&temp_diff_1);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )this,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                              *)this_00);
          }
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     this_00);
          std::__cxx11::string::~string((string *)&temp_diff);
          _Var11._M_p = (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)_Var11._M_p + 0x20))->field_2;
        }
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((const_object_range_type *)&ss,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)target
                  );
        uVar2 = ss.field_2._M_allocated_capacity;
        bVar1 = (byte)ss._M_string_length;
        uVar3 = ss.field_2._M_local_buf[8];
        bVar6 = (byte)ss._M_string_length & ss.field_2._M_local_buf[8];
        uVar10 = extraout_RDX_02;
        _Var11 = ss._M_dataplus;
        while( true ) {
          bVar5 = bVar1 == uVar3;
          if ((bVar6 & 1) != 0) {
            bVar5 = _Var11._M_p == (pointer)uVar2;
          }
          if (bVar5) break;
          temp_diff.field_0.int64_.val_ =
               (int64_t)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Var11._M_p)->_M_dataplus)._M_p;
          temp_diff.field_0._0_8_ =
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var11._M_p)->
               _M_string_length;
          cVar15 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                   find_abi_cxx11_((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                    *)source,(string_view_type *)&temp_diff);
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          object_range_abi_cxx11_
                    ((const_object_range_type *)&temp_diff,
                     (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                     source);
          if ((((undefined1  [16])cVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
             ((local_d0._M_local_buf[8] & 1U) == 0)) {
            bVar5 = cVar15.has_value_ == (bool)local_d0._M_local_buf[8];
          }
          else {
            bVar5 = cVar15.it_._M_current._M_current ==
                    (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     *)local_d0._M_allocated_capacity;
          }
          uVar10 = extraout_RDX_03;
          if (bVar5) {
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&temp_diff,path,(allocator<char> *)&temp_diff_1);
            std::__cxx11::string::push_back
                      ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &temp_diff);
            jsonpointer::escape<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       _Var11._M_p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &temp_diff);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                      (&val_2,(string *)&temp_diff_1);
            jsonpatch_names<char>::op_name_abi_cxx11_();
            local_40._M_len = temp_diff_1.field_0.int64_.val_;
            local_40._M_str = (char *)temp_diff_1.field_0._0_8_;
            jsonpatch_names<char>::add_name_abi_cxx11_();
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)&val,(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                *)&val_2,&local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val_4);
            std::__cxx11::string::~string((string *)&val_4);
            std::__cxx11::string::~string((string *)&temp_diff_1);
            jsonpatch_names<char>::path_name_abi_cxx11_();
            val.field_0._0_8_ = temp_diff_1.field_0.int64_.val_;
            val.field_0.int64_.val_ = temp_diff_1.field_0._0_8_;
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<std::__cxx11::string&>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)&val_4,
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       &val_2,(string_view_type *)&val,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &temp_diff);
            std::__cxx11::string::~string((string *)&temp_diff_1);
            jsonpatch_names<char>::value_name_abi_cxx11_();
            val.field_0._0_8_ = temp_diff_1.field_0.int64_.val_;
            val.field_0.int64_.val_ = temp_diff_1.field_0._0_8_;
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)&val_4,
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       &val_2,(string_view_type *)&val,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )((long)_Var11._M_p + 0x20));
            std::__cxx11::string::~string((string *)&temp_diff_1);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )this,&val_2);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                      (&val_2);
            std::__cxx11::string::~string((string *)&temp_diff);
            uVar10 = extraout_RDX_04;
          }
          _Var11._M_p = (pointer)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)_Var11._M_p + 0x20))->field_2;
        }
        goto LAB_002f2787;
      }
    }
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
              (&val_4,&ss);
    jsonpatch_names<char>::op_name_abi_cxx11_();
    val.field_0._0_8_ = ss._M_string_length;
    val.field_0.json_const_pointer_.ref_._M_data =
         (reference_wrapper<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          )(reference_wrapper<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            )ss._M_dataplus._M_p;
    jsonpatch_names<char>::replace_name_abi_cxx11_();
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    insert_or_assign<std::__cxx11::string>
              ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                *)&temp_diff_1,
               (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)&val_4,
               (string_view_type *)&val,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp_diff);
    std::__cxx11::string::~string((string *)&temp_diff);
    std::__cxx11::string::~string((string *)&ss);
    jsonpatch_names<char>::path_name_abi_cxx11_();
    temp_diff_1.field_0._0_8_ = ss._M_string_length;
    temp_diff_1.field_0.json_const_pointer_.ref_._M_data =
         (reference_wrapper<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          )(reference_wrapper<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            )ss._M_dataplus._M_p;
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    insert_or_assign<std::basic_string_view<char,std::char_traits<char>>const&>
              ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                *)&temp_diff,
               (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)&val_4,
               (string_view_type *)&temp_diff_1,path);
    std::__cxx11::string::~string((string *)&ss);
    jsonpatch_names<char>::value_name_abi_cxx11_();
    temp_diff_1.field_0._0_8_ = ss._M_string_length;
    temp_diff_1.field_0.json_const_pointer_.ref_._M_data =
         (reference_wrapper<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          )(reference_wrapper<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            )ss._M_dataplus._M_p;
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&>
              ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                *)&temp_diff,
               (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)&val_4,
               (string_view_type *)&temp_diff_1,target);
    std::__cxx11::string::~string((string *)&ss);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::push_back
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               &val_4);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json(&val_4);
    uVar10 = extraout_RDX_00;
  }
LAB_002f2787:
  bVar16.field_0.int64_.val_ = uVar10;
  bVar16.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>)bVar16.field_0;
}

Assistant:

Json from_diff(const Json& source, const Json& target, const typename Json::string_view_type& path)
    {
        using char_type = typename Json::char_type;

        Json result = typename Json::array();

        if (source == target)
        {
            return result;
        }

        if (source.is_array() && target.is_array())
        {
            std::size_t common = (std::min)(source.size(),target.size());
            for (std::size_t i = 0; i < common; ++i)
            {
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                auto temp_diff = from_diff(source[i],target[i],ss);
                result.insert(result.array_range().end(),temp_diff.array_range().begin(),temp_diff.array_range().end());
            }
            // Element in source, not in target - remove
            for (std::size_t i = source.size(); i-- > target.size();)
            {
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                Json val(json_object_arg);
                val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::remove_name());
                val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                result.push_back(std::move(val));
            }
            // Element in target, not in source - add, 
            // Fix contributed by Alexander rog13
            for (std::size_t i = source.size(); i < target.size(); ++i)
            {
                const auto& a = target[i];
                std::basic_string<char_type> ss(path); 
                ss.push_back('/');
                jsoncons::detail::from_integer(i,ss);
                Json val(json_object_arg);
                val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::add_name());
                val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                val.insert_or_assign(jsonpatch_names<char_type>::value_name(), a);
                result.push_back(std::move(val));
            }
        }
        else if (source.is_object() && target.is_object())
        {
            for (const auto& a : source.object_range())
            {
                std::basic_string<char_type> ss(path);
                ss.push_back('/'); 
                jsonpointer::escape(a.key(),ss);
                auto it = target.find(a.key());
                if (it != target.object_range().end())
                {
                    auto temp_diff = from_diff(a.value(),(*it).value(),ss);
                    result.insert(result.array_range().end(),temp_diff.array_range().begin(),temp_diff.array_range().end());
                }
                else
                {
                    Json val(json_object_arg);
                    val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::remove_name());
                    val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                    result.push_back(std::move(val));
                }
            }
            for (const auto& a : target.object_range())
            {
                auto it = source.find(a.key());
                if (it == source.object_range().end())
                {
                    std::basic_string<char_type> ss(path); 
                    ss.push_back('/');
                    jsonpointer::escape(a.key(),ss);
                    Json val(json_object_arg);
                    val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::add_name());
                    val.insert_or_assign(jsonpatch_names<char_type>::path_name(), ss);
                    val.insert_or_assign(jsonpatch_names<char_type>::value_name(), a.value());
                    result.push_back(std::move(val));
                }
            }
        }
        else
        {
            Json val(json_object_arg);
            val.insert_or_assign(jsonpatch_names<char_type>::op_name(), jsonpatch_names<char_type>::replace_name());
            val.insert_or_assign(jsonpatch_names<char_type>::path_name(), path);
            val.insert_or_assign(jsonpatch_names<char_type>::value_name(), target);
            result.push_back(std::move(val));
        }

        return result;
    }